

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariableStackFrame.cpp
# Opt level: O0

bool __thiscall
Jinx::Impl::VariableStackFrame::VariableAssign(VariableStackFrame *this,String *name)

{
  bool bVar1;
  pointer psVar2;
  reference this_00;
  size_t varParts_00;
  size_t sVar3;
  size_t varParts;
  value_type *variableSet;
  _Self local_48;
  _Self *local_40;
  iterator *itr;
  undefined1 local_30 [8];
  reverse_iterator ritr;
  FrameData *frame;
  String *name_local;
  VariableStackFrame *this_local;
  
  bVar1 = std::
          vector<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
          ::empty(&this->m_frames);
  if (bVar1) {
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_Jinx::StaticAllocator<char,_2048UL,_16UL>_>::
    operator=(&this->m_errorMessage,"Unexpected empty variable frame");
    this_local._7_1_ = false;
  }
  else {
    ritr.current._M_current =
         (__normal_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_*,_std::vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>_>
          )std::
           vector<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
           ::back(&this->m_frames);
    bVar1 = std::
            vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
            ::empty((vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                     *)ritr.current._M_current);
    if (bVar1) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_Jinx::StaticAllocator<char,_2048UL,_16UL>_>::
      operator=(&this->m_errorMessage,"Attempting to assign a variable to an empty stack");
      this_local._7_1_ = false;
    }
    else {
      std::
      vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
      ::rbegin((vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                *)local_30);
      while( true ) {
        std::
        vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
        ::rend((vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                *)&itr);
        bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_*,_std::vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>_>_>
                                 *)local_30,
                                (reverse_iterator<__gnu_cxx::__normal_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_*,_std::vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>_>_>
                                 *)&itr);
        if (!bVar1) break;
        psVar2 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_*,_std::vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_*,_std::vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>_>_>
                               *)local_30);
        local_48._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
             ::find(psVar2,name);
        local_40 = &local_48;
        psVar2 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_*,_std::vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>_>_>
                 ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_*,_std::vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>_>_>
                               *)local_30);
        variableSet = (value_type *)
                      std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
                      ::end(psVar2);
        bVar1 = std::operator!=(&local_48,(_Self *)&variableSet);
        if (bVar1) {
          return true;
        }
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_*,_std::vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_*,_std::vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>_>_>
                      *)local_30);
      }
      this_00 = std::
                vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                ::back((vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
                        *)ritr.current._M_current);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>
      ::insert(this_00,name);
      varParts_00 = GetNamePartCount(name);
      sVar3 = GetMaxVariableParts(this);
      if (sVar3 < varParts_00) {
        SetMaxVariableParts(this,varParts_00);
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline_t bool VariableStackFrame::VariableAssign(const String & name)
	{
		// Sanity check
		if (m_frames.empty())
		{
			m_errorMessage = "Unexpected empty variable frame";
			return false;
		}

		// Retrieve the current frame data
		FrameData & frame = m_frames.back();
		if (frame.stack.empty())
		{
			m_errorMessage = "Attempting to assign a variable to an empty stack";
			return false;
		}

		// Work from the top of the stack down, and attempt to find an existing name
		for (auto ritr = frame.stack.rbegin(); ritr != frame.stack.rend(); ++ritr)
		{
			const auto & itr = ritr->find(name);
			if (itr != ritr->end())
				return true;
		}

		// If we don't find the name, create a new variable on the top of the stack
		auto & variableSet = frame.stack.back();
		variableSet.insert(name);

		// Adjust the max variable parts value if necessary
		size_t varParts = GetNamePartCount(name);
		if (varParts > GetMaxVariableParts())
			SetMaxVariableParts(varParts);

		return true;
	}